

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void populateCellCache(CellArray *p,int idx,int N)

{
  u16 uVar1;
  int local_18;
  int local_14;
  int N_local;
  int idx_local;
  CellArray *p_local;
  
  local_14 = idx;
  for (local_18 = N; 0 < local_18; local_18 = local_18 + -1) {
    if (p->szCell[local_14] == 0) {
      uVar1 = (*p->pRef->xCellSize)(p->pRef,p->apCell[local_14]);
      p->szCell[local_14] = uVar1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

static void populateCellCache(CellArray *p, int idx, int N){
  assert( idx>=0 && idx+N<=p->nCell );
  while( N>0 ){
    assert( p->apCell[idx]!=0 );
    if( p->szCell[idx]==0 ){
      p->szCell[idx] = p->pRef->xCellSize(p->pRef, p->apCell[idx]);
    }else{
      assert( CORRUPT_DB ||
              p->szCell[idx]==p->pRef->xCellSize(p->pRef, p->apCell[idx]) );
    }
    idx++;
    N--;
  }
}